

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  ulong numcodes_00;
  long lVar1;
  uint uVar2;
  uint *lengths;
  long lVar3;
  ulong uVar4;
  
  lVar3 = ~numcodes << 2;
  uVar4 = numcodes + 1;
  do {
    numcodes_00 = uVar4 - 1;
    lVar3 = lVar3 + 4;
    if (numcodes_00 <= mincodes) break;
    lVar1 = uVar4 - 2;
    uVar4 = numcodes_00;
  } while (frequencies[lVar1] == 0);
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (uint)numcodes_00;
  lengths = (uint *)realloc(tree->lengths,-lVar3);
  tree->lengths = lengths;
  if (lengths == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    for (uVar4 = 0; numcodes_00 != uVar4; uVar4 = uVar4 + 1) {
      lengths[uVar4] = 0;
    }
    uVar2 = lodepng_huffman_code_lengths(lengths,frequencies,numcodes_00,maxbitlen);
    if (uVar2 == 0) {
      uVar2 = HuffmanTree_makeFromLengths2(tree);
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen) {
  size_t i;
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  for(i = 0; i < numcodes; i++) tree->lengths[i] = 0;

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}